

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void>::visit
          (ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *this,Arg *arg)

{
  StringValue<char> value;
  StringValue<wchar_t> SVar1;
  PrintfArgFormatter<char> *in_RSI;
  ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *in_RDI;
  PrintfArgFormatter<char> *in_stack_00000010;
  CustomValue in_stack_00000018;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa8;
  bool in_stack_ffffffffffffffaf;
  undefined8 in_stack_ffffffffffffffe8;
  
  switch(*(undefined4 *)
          &in_RSI[1].super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>.writer_)
  {
  case 0:
  case 1:
    break;
  case 2:
    visit_int((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)
              CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    break;
  case 3:
    visit_uint((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    break;
  case 4:
    visit_long_long((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)
                    CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 5:
    visit_ulong_long((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)
                     CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 6:
    internal::PrintfArgFormatter<char>::visit_bool
              ((PrintfArgFormatter<char> *)in_RDI,in_stack_ffffffffffffffaf);
    break;
  case 7:
    internal::PrintfArgFormatter<char>::visit_char
              (in_RSI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    break;
  case 8:
    visit_double((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)
                 CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                 (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 9:
    visit_long_double(in_RDI,(longdouble)
                             CONCAT28(in_stack_ffffffffffffffa8,
                                      CONCAT62(in_stack_ffffffffffffffa2,
                                               (short)((unkuint10)
                                                       *(unkbyte10 *)
                                                        &in_RSI->
                                                  super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>
                                                  >> 0x40))));
    break;
  case 10:
    internal::PrintfArgFormatter<char>::visit_cstring
              ((PrintfArgFormatter<char> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 0xb:
    value.value._4_4_ = in_stack_ffffffffffffff9c;
    value.value._0_4_ = in_stack_ffffffffffffff98;
    value.size._0_2_ = in_stack_ffffffffffffffa0;
    value.size._2_6_ = in_stack_ffffffffffffffa2;
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::visit_string
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)0x1d840d,value);
    break;
  case 0xc:
    SVar1.value._4_4_ = in_stack_ffffffffffffff9c;
    SVar1.value._0_4_ = in_stack_ffffffffffffff98;
    SVar1.size._0_2_ = in_stack_ffffffffffffffa0;
    SVar1.size._2_6_ = in_stack_ffffffffffffffa2;
    visit_wstring((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)0x1d8439,SVar1);
    break;
  case 0xd:
    internal::PrintfArgFormatter<char>::visit_pointer
              ((PrintfArgFormatter<char> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
               (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 0xe:
    internal::PrintfArgFormatter<char>::visit_custom(in_stack_00000010,in_stack_00000018);
  }
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }